

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void fits_set_region_components(SAORegion *aRgn)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  RgnShape *pRVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  char *__dest;
  long lVar10;
  long lVar11;
  
  uVar8 = 0;
  do {
    uVar2 = aRgn->nShapes;
    if ((int)uVar2 <= (int)uVar8) {
      uVar5 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar5;
      }
      iVar7 = 0;
      for (; uVar6 * 0xa8 - uVar5 != 0; uVar5 = uVar5 + 0xa8) {
        iVar7 = (iVar7 + 1) - (uint)((&aRgn->Shapes->sign)[uVar5] == '\0');
        *(int *)((long)&aRgn->Shapes->comp + uVar5) = iVar7;
      }
      return;
    }
    if (aRgn->Shapes[(int)uVar8].sign == '\0') {
      uVar2 = 1;
      if ((int)uVar8 < 1) {
        uVar2 = uVar8;
      }
      pRVar4 = aRgn->Shapes + uVar8;
      uVar1 = uVar8;
      do {
        pRVar4 = pRVar4 + -1;
        uVar3 = uVar2;
        if ((int)uVar1 < 2) break;
        uVar3 = uVar1;
        uVar1 = uVar1 - 1;
      } while (pRVar4->sign == '\0');
      for (lVar10 = (long)(int)(uVar3 - 2); -1 < lVar10; lVar10 = lVar10 + -1) {
        if (aRgn->Shapes[lVar10].sign != '\0') {
          pRVar4 = (RgnShape *)realloc(aRgn->Shapes,(long)aRgn->nShapes * 0xa8 + 0xa8);
          aRgn->Shapes = pRVar4;
          lVar11 = (long)aRgn->nShapes;
          aRgn->nShapes = aRgn->nShapes + 1;
          lVar9 = lVar11 * 0xa8;
          for (; lVar10 + 1 < lVar11; lVar11 = lVar11 + -1) {
            __dest = &aRgn->Shapes->sign + lVar9;
            memcpy(__dest,__dest + -0xa8,0xa8);
            lVar9 = lVar9 + -0xa8;
          }
          uVar8 = uVar8 + 1;
          memcpy(aRgn->Shapes + lVar10 + 1,aRgn->Shapes + (int)uVar8,0xa8);
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void fits_set_region_components ( SAORegion *aRgn )
{
/* 
   Internal routine to turn a collection of regions read from an ascii file into
   the more complex structure that is allowed by the FITS REGION extension with
   multiple components. Regions are anded within components and ored between them
   ie for a pixel to be selected it must be selected by at least one component
   and to be selected by a component it must be selected by all that component's
   shapes.

   The algorithm is to replicate every exclude region after every include
   region before it in the list. eg reg1, reg2, -reg3, reg4, -reg5 becomes
   (reg1, -reg3, -reg5), (reg2, -reg5, -reg3), (reg4, -reg5) where the
   parentheses designate components.
*/

  int i, j, k, icomp;

/* loop round shapes */

  i = 0;
  while ( i<aRgn->nShapes ) {

    /* first do the case of an exclude region */

    if ( !aRgn->Shapes[i].sign ) {

      /* we need to run back through the list copying the current shape as
	 required. start by findin the first include shape before this exclude */

      j = i-1;
      while ( j > 0 && !aRgn->Shapes[j].sign ) j--;

      /* then go back one more shape */

      j--;

      /* and loop back through the regions */

      while ( j >= 0 ) {

	/* if this is an include region then insert a copy of the exclude
	   region immediately after it */
           
        /* Note that this makes shallow copies of a polygon's dynamically
        allocated Pts array -- the memory is shared.  This must be checked
        when freeing in fits_free_region. */

	if ( aRgn->Shapes[j].sign ) {

	  aRgn->Shapes = (RgnShape *) realloc (aRgn->Shapes,(1+aRgn->nShapes)*sizeof(RgnShape));
	  aRgn->nShapes++;
	  for (k=aRgn->nShapes-1; k>j+1; k--) aRgn->Shapes[k] = aRgn->Shapes[k-1];

	  i++;
	  aRgn->Shapes[j+1] = aRgn->Shapes[i];

	}

	j--;

      }

    }

    i++;

  }

  /* now set the component numbers */

  icomp = 0;
  for ( i=0; i<aRgn->nShapes; i++ ) {
    if ( aRgn->Shapes[i].sign ) icomp++;
    aRgn->Shapes[i].comp = icomp;

    /*
    printf("i = %d, shape = %d, sign = %d, comp = %d\n", i, aRgn->Shapes[i].shape, aRgn->Shapes[i].sign, aRgn->Shapes[i].comp);
    */

  }

  return;

}